

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::relative_path(path *__return_storage_ptr__,path *this)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  _Alloc_hider _Var5;
  _Alloc_hider local_48;
  ulong local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (2 < (this->_path)._M_string_length) {
    pcVar1 = (this->_path)._M_dataplus._M_p;
    if ((((((*pcVar1 != '/') || (pcVar1[1] != '/')) || (pcVar1[2] == 0x2f)) ||
         ((iVar3 = isprint((int)pcVar1[2]), iVar3 == 0 ||
          (std::__cxx11::string::find((char)this,0x2f), 2 < (this->_path)._M_string_length)))) &&
        ((pcVar1 = (this->_path)._M_dataplus._M_p, *pcVar1 == '/' &&
         ((pcVar1[1] == '/' && (pcVar1[2] != 0x2f)))))) &&
       (iVar3 = isprint((int)pcVar1[2]), iVar3 != 0)) {
      std::__cxx11::string::find((char)this,0x2f);
    }
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
  uVar2 = local_40;
  _Var5._M_p = (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = _Var5._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p == &local_38) {
    *(undefined4 *)_Var5._M_p = local_38._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->_path).field_2 + 4) =
         local_38._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) = local_38._8_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->_path).field_2 + 0xc) = local_38._12_4_;
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p = local_48._M_p;
    (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
         CONCAT44(local_38._M_allocated_capacity._4_4_,local_38._M_allocated_capacity._0_4_);
    _Var5._M_p = local_48._M_p;
  }
  (__return_storage_ptr__->_path)._M_string_length = local_40;
  local_40 = 0;
  local_38._M_allocated_capacity._0_4_ = local_38._M_allocated_capacity._0_4_ & 0xffffff00;
  local_48._M_p = (pointer)&local_38;
  if ((((uVar2 < 3) || (*_Var5._M_p != '/')) || (_Var5._M_p[1] != '/')) || (_Var5._M_p[2] == '/')) {
    _Var4 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (_Var5._M_p,(char *)(uVar2 + (long)_Var5._M_p));
  }
  else {
    _Var4 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      ((char *)((long)_Var5._M_p + 2),(char *)(uVar2 + (long)_Var5._M_p));
  }
  (__return_storage_ptr__->_path)._M_string_length =
       (long)_Var4._M_current - (long)(__return_storage_ptr__->_path)._M_dataplus._M_p;
  *_Var4._M_current = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,
                    CONCAT44(local_38._M_allocated_capacity._4_4_,
                             local_38._M_allocated_capacity._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return path(_path.substr((std::min)(rootPathLen, _path.length())), generic_format);
}